

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

UninterpretedOption *
google::protobuf::DownCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  int iVar1;
  ClassData *pCVar2;
  undefined4 extraout_var;
  LogMessage *this;
  MessageLite *pMVar3;
  LogMessageFatal local_60 [16];
  GetTypeNameReturnType local_50;
  GetTypeNameReturnType local_30;
  
  if (from == (MessageLite *)0x0) {
    pMVar3 = (MessageLite *)0x0;
  }
  else {
    pCVar2 = UninterpretedOption::GetClassData
                       ((UninterpretedOption *)&_UninterpretedOption_default_instance_);
    iVar1 = (*from->_vptr_MessageLite[4])(from);
    pMVar3 = (MessageLite *)0x0;
    if (pCVar2 == (ClassData *)CONCAT44(extraout_var,iVar1)) {
      pMVar3 = from;
    }
  }
  if (pMVar3 != from) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,0x55c,0x23,"DynamicCastMessage<T>(from) == from");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_60,0x10,"Cannot downcast ");
    MessageLite::GetTypeName_abi_cxx11_(&local_30,from);
    this = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<
                     ((LogMessage *)local_60,(string *)&local_30);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(this,4," to ");
    MessageLite::GetTypeName_abi_cxx11_
              (&local_50,(MessageLite *)&_UninterpretedOption_default_instance_);
    absl::lts_20240722::log_internal::LogMessage::operator<<(this,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
  }
  return (UninterpretedOption *)from;
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}